

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

int __thiscall wabt::Const::lane_count(Const *this)

{
  uint uVar1;
  Type TVar2;
  
  TVar2 = lane_type(this);
  if (0xfffffff8 < (uint)TVar2.enum_) {
    uVar1 = TVar2.enum_ + I32U;
    if ((0x7bU >> (uVar1 & 0x1f) & 1) != 0) {
      return *(int *)(&DAT_0016c598 + (long)(int)uVar1 * 4);
    }
  }
  abort();
}

Assistant:

int lane_count() const {
    switch (lane_type()) {
      case Type::I8:  return 16;
      case Type::I16: return 8;
      case Type::I32: return 4;
      case Type::I64: return 2;
      case Type::F32: return 4;
      case Type::F64: return 2;
      default: WABT_UNREACHABLE;
    }
  }